

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csv_reporter.cc
# Opt level: O2

bool __thiscall benchmark::CSVReporter::ReportContext(CSVReporter *this,Context *context)

{
  ostream *poVar1;
  string *psVar2;
  string *psVar3;
  
  BenchmarkReporter::PrintBasicContext((this->super_BenchmarkReporter).error_stream_,context);
  poVar1 = (this->super_BenchmarkReporter).output_stream_;
  psVar2 = DAT_0014ba50;
  psVar3 = (anonymous_namespace)::elements_abi_cxx11_;
  while (psVar3 != psVar2) {
    psVar2 = psVar3 + 0x20;
    std::operator<<(poVar1,psVar3);
    psVar3 = psVar2;
    if (psVar2 != DAT_0014ba50) {
      std::operator<<(poVar1,",");
      psVar2 = DAT_0014ba50;
    }
  }
  std::operator<<(poVar1,"\n");
  return true;
}

Assistant:

bool CSVReporter::ReportContext(const Context& context) {
  PrintBasicContext(&GetErrorStream(), context);

  std::ostream& Out = GetOutputStream();
  for (auto B = elements.begin(); B != elements.end(); ) {
    Out << *B++;
    if (B != elements.end())
      Out << ",";
  }
  Out << "\n";
  return true;
}